

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iremga20.c
# Opt level: O0

UINT8 irem_ga20_r(void *info,UINT8 offset)

{
  int channel;
  ga20_state *chip;
  UINT8 offset_local;
  void *info_local;
  
  if ((~(offset & 0x1f) & 7) == 0) {
    info_local._7_1_ =
         *(UINT8 *)((long)info + (long)(int)(uint)((offset & 0x1f) >> 3) * 0x1c + 0x4c);
  }
  else {
    info_local._7_1_ = '\0';
  }
  return info_local._7_1_;
}

Assistant:

static UINT8 irem_ga20_r(void *info, UINT8 offset)
{
	ga20_state *chip = (ga20_state *)info;
	int channel;

	offset &= 0x1F;
	channel = offset >> 3;

	switch (offset & 0x7)
	{
		case 7: // voice status. bit 0 is 1 if active. (routine around 0xccc in rtypeleo)
			return chip->channel[channel].play;

		default:
			logerror("GA20: read unk. register %d, channel %d\n", offset & 0x7, channel);
			break;
	}

	return 0;
}